

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_sse4.c
# Opt level: O0

void av1_warp_affine_sse4_1
               (int32_t *mat,uint8_t *ref,int width,int height,int stride,uint8_t *pred,int p_col,
               int p_row,int p_width,int p_height,int p_stride,int subsampling_x,int subsampling_y,
               ConvolveParams *conv_params,int16_t alpha,int16_t beta,int16_t gamma,int16_t delta)

{
  byte bVar1;
  undefined8 uVar2;
  int iVar3;
  __m128i src_00;
  int iVar4;
  int iVar5;
  uint round_bits_00;
  uint uVar6;
  long lVar7;
  long lVar8;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  int *in_RDI;
  int in_R8D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  byte in_stack_00000030;
  byte in_stack_00000038;
  long in_stack_00000040;
  short in_stack_00000048;
  short in_stack_00000050;
  short in_stack_00000058;
  short in_stack_00000060;
  __m128i shuffle_reg_right;
  __m128i shuffle_reg_left;
  __m128i src;
  int sx;
  int iy_2;
  int out_of_boundary_right;
  int out_of_boundary_left;
  int iy_1;
  int iy;
  int32_t sy4;
  int32_t iy4;
  int32_t sx4;
  int32_t ix4;
  int64_t y4;
  int64_t x4;
  int64_t dst_y;
  int64_t dst_x;
  int32_t src_y;
  int32_t src_x;
  __m128i res_add_const_1;
  int offset_bits;
  int round_bits;
  __m128i res_add_const;
  __m128i reduce_bits_vert_const;
  int offset_bits_vert;
  int offset_bits_horiz;
  int reduce_bits_vert;
  int reduce_bits_horiz;
  int bd;
  int k;
  int j;
  int i;
  __m128i tmp [15];
  undefined8 *in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc54;
  int in_stack_fffffffffffffc58;
  int16_t in_stack_fffffffffffffc5c;
  int16_t in_stack_fffffffffffffc5e;
  int in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc64;
  int in_stack_fffffffffffffc68;
  uint in_stack_fffffffffffffc6c;
  undefined2 in_stack_fffffffffffffc70;
  short in_stack_fffffffffffffc72;
  int in_stack_fffffffffffffc74;
  int in_stack_fffffffffffffc78;
  uint in_stack_fffffffffffffc7c;
  int local_37c;
  int in_stack_fffffffffffffc90;
  int local_36c;
  undefined8 in_stack_fffffffffffffc98;
  undefined8 in_stack_fffffffffffffca0;
  undefined8 in_stack_fffffffffffffca8;
  undefined8 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb8 [16];
  int in_stack_fffffffffffffcc8;
  int local_334;
  int in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffcd8;
  int local_324;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  int local_2d0;
  int local_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  int local_2a8;
  undefined4 local_2a4;
  int local_2a0;
  int local_29c;
  undefined4 local_298;
  int local_294;
  int local_290;
  int local_28c;
  undefined8 local_288 [32];
  int local_184;
  int local_180;
  int local_17c;
  long local_178;
  int *local_170;
  int local_164;
  int local_160;
  int local_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  short local_134;
  short local_132;
  uint8_t (*local_130) [16];
  uint8_t (*local_128) [16];
  undefined1 (*local_120) [16];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  short local_68;
  short local_66;
  short local_64;
  short local_62;
  short local_60;
  short local_5e;
  short local_5c;
  short local_5a;
  undefined8 local_58;
  undefined8 uStack_50;
  short local_40;
  short local_3e;
  short local_3c;
  short local_3a;
  short local_38;
  short local_36;
  short local_34;
  short local_32;
  
  local_298 = 8;
  local_29c = *(int *)(in_stack_00000040 + 0x14);
  if (*(int *)(in_stack_00000040 + 0x20) == 0) {
    local_36c = 0xe - local_29c;
  }
  else {
    local_36c = *(int *)(in_stack_00000040 + 0x18);
  }
  local_2a0 = local_36c;
  iVar4 = local_2a0;
  local_2a4 = 0xe;
  local_2a8 = 0x16 - local_29c;
  local_2a0._0_1_ = (byte)local_36c;
  local_15c = (1 << ((byte)local_2a0 & 0x1f)) >> 1;
  local_2b8 = CONCAT44(local_15c,local_15c);
  uStack_2b0 = CONCAT44(local_15c,local_15c);
  local_160 = 1 << ((byte)local_2a8 & 0x1f);
  local_2c8 = CONCAT44(local_160,local_160);
  uStack_2c0 = CONCAT44(local_160,local_160);
  local_2cc = (0xe - *(int *)(in_stack_00000040 + 0x14)) - *(int *)(in_stack_00000040 + 0x18);
  local_2d0 = 0x16 - *(int *)(in_stack_00000040 + 0x14);
  if (*(int *)(in_stack_00000040 + 0x20) == 1) {
    local_2e8 = CONCAT44(local_15c + local_160,local_15c + local_160);
    uStack_2e0 = CONCAT44(local_15c + local_160,local_15c + local_160);
    local_158 = local_2c8;
    uStack_150 = uStack_2c0;
    local_148 = local_2b8;
    uStack_140 = uStack_2b0;
  }
  else {
    in_stack_fffffffffffffc90 = 1 << ((byte)local_2a0 + 7 & 0x1f);
    local_164 = ((1 << ((byte)local_2a0 & 0x1f)) >> 1) - in_stack_fffffffffffffc90;
    local_2e8 = CONCAT44(local_164,local_164);
    uStack_2e0 = CONCAT44(local_164,local_164);
    local_98 = local_2e8;
    uStack_90 = uStack_2e0;
    local_88 = local_164;
    local_84 = local_164;
    local_80 = local_164;
    local_7c = local_164;
  }
  local_2a0 = iVar4;
  local_184 = in_R8D;
  local_180 = in_ECX;
  local_17c = in_EDX;
  local_178 = in_RSI;
  local_170 = in_RDI;
  local_d8 = local_2b8;
  uStack_d0 = uStack_2b0;
  local_c8 = local_15c;
  local_c4 = local_15c;
  local_c0 = local_15c;
  local_bc = local_15c;
  local_b8 = local_2c8;
  uStack_b0 = uStack_2c0;
  local_a8 = local_160;
  local_a4 = local_160;
  local_a0 = local_160;
  local_9c = local_160;
  for (local_28c = 0; local_28c < in_stack_00000020; local_28c = local_28c + 8) {
    for (local_290 = 0; local_290 < in_stack_00000018; local_290 = local_290 + 8) {
      iVar4 = in_stack_00000008 + local_290 + 4 << (in_stack_00000030 & 0x1f);
      iVar5 = in_stack_00000010 + local_28c + 4 << (in_stack_00000038 & 0x1f);
      lVar7 = (long)local_170[2] * (long)iVar4 + (long)local_170[3] * (long)iVar5 + (long)*local_170
              >> (in_stack_00000030 & 0x3f);
      lVar8 = (long)local_170[4] * (long)iVar4 + (long)local_170[5] * (long)iVar5 +
              (long)local_170[1] >> (in_stack_00000038 & 0x3f);
      iVar4 = (int)((ulong)lVar7 >> 0x10);
      iVar5 = (int)((ulong)lVar8 >> 0x10);
      round_bits_00 =
           in_stack_00000048 * -4 + in_stack_00000050 * -4 + 0x10200 + ((uint)lVar7 & 0xffff) &
           0xffffffc0;
      uVar6 = in_stack_00000058 * -4 + in_stack_00000060 * -4 + 0x10200 + ((uint)lVar8 & 0xffff) &
              0xffffffc0;
      if (iVar4 < -6) {
        local_294 = -7;
        while( true ) {
          if (in_stack_00000020 - local_28c < 9) {
            local_37c = in_stack_00000020 - local_28c;
          }
          else {
            local_37c = 8;
          }
          if (local_37c <= local_294) break;
          local_324 = iVar5 + local_294;
          if (local_324 < 0) {
            local_324 = 0;
          }
          else if (local_180 + -1 < local_324) {
            local_324 = local_180 + -1;
          }
          bVar1 = *(byte *)(local_178 + local_324 * local_184);
          in_stack_fffffffffffffc7c = (uint)bVar1;
          local_132 = (short)(1 << (0xeU - (char)local_29c & 0x1f)) +
                      (ushort)bVar1 * (short)(1 << (7U - (char)local_29c & 0x1f));
          local_78 = CONCAT26(local_132,CONCAT24(local_132,CONCAT22(local_132,local_132)));
          uVar2 = CONCAT26(local_132,CONCAT24(local_132,CONCAT22(local_132,local_132)));
          uStack_70 = uVar2;
          local_68 = local_132;
          local_66 = local_132;
          local_64 = local_132;
          local_62 = local_132;
          local_60 = local_132;
          local_5e = local_132;
          local_5c = local_132;
          local_5a = local_132;
          local_288[(long)(local_294 + 7) * 2] = local_78;
          local_288[(long)(local_294 + 7) * 2 + 1] = uVar2;
          local_294 = local_294 + 1;
        }
      }
      else if (iVar4 < local_17c + 6) {
        if ((iVar4 + -7 < 0) || (local_17c < iVar4 + 9)) {
          iVar3 = -(iVar4 + -6);
          in_stack_fffffffffffffcd0 = (iVar4 + 8) - local_17c;
          local_294 = -7;
          while( true ) {
            if (in_stack_00000020 - local_28c < 9) {
              in_stack_fffffffffffffc64 = in_stack_00000020 - local_28c;
            }
            else {
              in_stack_fffffffffffffc64 = 8;
            }
            in_stack_fffffffffffffc68 = local_294;
            if (in_stack_fffffffffffffc64 <= local_294) break;
            local_334 = iVar5 + local_294;
            if (local_334 < 0) {
              local_334 = 0;
            }
            else if (local_180 + -1 < local_334) {
              local_334 = local_180 + -1;
            }
            in_stack_fffffffffffffcc8 = round_bits_00 + (int)in_stack_00000050 * (local_294 + 4);
            lVar7 = local_178 + local_334 * local_184 + (long)iVar4;
            local_120 = (undefined1 (*) [16])(lVar7 + -7);
            in_stack_fffffffffffffcb8 = *local_120;
            if (-1 < iVar3) {
              local_128 = warp_pad_left + iVar3;
              in_stack_fffffffffffffca8 = *(undefined8 *)*local_128;
              in_stack_fffffffffffffcb0 = *(undefined8 *)(warp_pad_left[iVar3] + 8);
              in_stack_fffffffffffffcb8 = pshufb(*local_120,(undefined1  [16])*local_128);
              local_f8 = in_stack_fffffffffffffca8;
              uStack_f0 = in_stack_fffffffffffffcb0;
              local_e8 = *(undefined8 *)*local_120;
              uStack_e0 = *(undefined8 *)(lVar7 + 1);
            }
            if (-1 < in_stack_fffffffffffffcd0) {
              local_130 = warp_pad_right + in_stack_fffffffffffffcd0;
              in_stack_fffffffffffffc98 = *(undefined8 *)*local_130;
              in_stack_fffffffffffffca0 =
                   *(undefined8 *)(warp_pad_right[in_stack_fffffffffffffcd0] + 8);
              local_108 = in_stack_fffffffffffffcb8._0_8_;
              uStack_100 = in_stack_fffffffffffffcb8._8_8_;
              in_stack_fffffffffffffcb8 =
                   pshufb(in_stack_fffffffffffffcb8,(undefined1  [16])*local_130);
              local_118 = in_stack_fffffffffffffc98;
              uStack_110 = in_stack_fffffffffffffca0;
            }
            src_00[0]._2_2_ = in_stack_fffffffffffffc72;
            src_00[0]._0_2_ = in_stack_fffffffffffffc70;
            src_00[0]._4_4_ = in_stack_fffffffffffffc74;
            src_00[1]._0_4_ = in_stack_fffffffffffffc78;
            src_00[1]._4_4_ = in_stack_fffffffffffffc7c;
            horizontal_filter(src_00,(__m128i *)CONCAT44(in_stack_fffffffffffffc6c,local_294),
                              in_stack_fffffffffffffc64,in_stack_fffffffffffffc60,
                              CONCAT22(in_stack_fffffffffffffc5e,in_stack_fffffffffffffc5c),
                              in_stack_fffffffffffffc58,in_stack_fffffffffffffc54);
            local_294 = local_294 + 1;
          }
        }
        else {
          prepare_warp_horizontal_filter
                    ((uint8_t *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                     (__m128i *)
                     CONCAT26(in_stack_fffffffffffffc5e,
                              CONCAT24(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58)),
                     in_stack_fffffffffffffc54,in_stack_fffffffffffffc50,
                     (int32_t)((ulong)in_stack_fffffffffffffc48 >> 0x20),local_29c,
                     in_stack_fffffffffffffc90,(int)in_stack_fffffffffffffc98,
                     (int)in_stack_fffffffffffffca0,(int)in_stack_fffffffffffffca8,
                     (int)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcb8._0_4_,
                     in_stack_fffffffffffffcb8._8_4_);
        }
      }
      else {
        local_294 = -7;
        while( true ) {
          if (in_stack_00000020 - local_28c < 9) {
            in_stack_fffffffffffffc74 = in_stack_00000020 - local_28c;
          }
          else {
            in_stack_fffffffffffffc74 = 8;
          }
          in_stack_fffffffffffffc78 = local_294;
          if (in_stack_fffffffffffffc74 <= local_294) break;
          in_stack_fffffffffffffcd8 = iVar5 + local_294;
          if (in_stack_fffffffffffffcd8 < 0) {
            in_stack_fffffffffffffcd8 = 0;
          }
          else if (local_180 + -1 < in_stack_fffffffffffffcd8) {
            in_stack_fffffffffffffcd8 = local_180 + -1;
          }
          bVar1 = *(byte *)(local_178 + (local_17c + -1 + in_stack_fffffffffffffcd8 * local_184));
          in_stack_fffffffffffffc6c = (uint)bVar1;
          in_stack_fffffffffffffc72 =
               (short)(1 << (0xeU - (char)local_29c & 0x1f)) +
               (ushort)bVar1 * (short)(1 << (7U - (char)local_29c & 0x1f));
          local_58 = CONCAT26(in_stack_fffffffffffffc72,
                              CONCAT24(in_stack_fffffffffffffc72,
                                       CONCAT22(in_stack_fffffffffffffc72,in_stack_fffffffffffffc72)
                                      ));
          uVar2 = CONCAT26(in_stack_fffffffffffffc72,
                           CONCAT24(in_stack_fffffffffffffc72,
                                    CONCAT22(in_stack_fffffffffffffc72,in_stack_fffffffffffffc72)));
          local_134 = in_stack_fffffffffffffc72;
          uStack_50 = uVar2;
          local_40 = in_stack_fffffffffffffc72;
          local_3e = in_stack_fffffffffffffc72;
          local_3c = in_stack_fffffffffffffc72;
          local_3a = in_stack_fffffffffffffc72;
          local_38 = in_stack_fffffffffffffc72;
          local_36 = in_stack_fffffffffffffc72;
          local_34 = in_stack_fffffffffffffc72;
          local_32 = in_stack_fffffffffffffc72;
          local_288[(long)(local_294 + 7) * 2] = local_58;
          local_288[(long)(local_294 + 7) * 2 + 1] = uVar2;
          local_294 = local_294 + 1;
        }
      }
      in_stack_fffffffffffffc48 = &local_2e8;
      in_stack_fffffffffffffc50 = local_2cc;
      in_stack_fffffffffffffc58 = local_2d0;
      prepare_warp_vertical_filter
                ((uint8_t *)
                 CONCAT44(in_stack_fffffffffffffc74,
                          CONCAT22(in_stack_fffffffffffffc72,in_stack_fffffffffffffc70)),
                 (__m128i *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                 (ConvolveParams *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                 in_stack_fffffffffffffc5e,in_stack_fffffffffffffc5c,local_2d0,
                 (int)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcb8._0_4_,
                 in_stack_fffffffffffffcb8._8_4_,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcd0
                 ,in_stack_fffffffffffffcd8,(__m128i *)CONCAT44(iVar5,uVar6),round_bits_00,
                 (int)lVar8);
    }
  }
  return;
}

Assistant:

void av1_warp_affine_sse4_1(const int32_t *mat, const uint8_t *ref, int width,
                            int height, int stride, uint8_t *pred, int p_col,
                            int p_row, int p_width, int p_height, int p_stride,
                            int subsampling_x, int subsampling_y,
                            ConvolveParams *conv_params, int16_t alpha,
                            int16_t beta, int16_t gamma, int16_t delta) {
  __m128i tmp[15];
  int i, j, k;
  const int bd = 8;
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));

  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const __m128i reduce_bits_vert_const =
      _mm_set1_epi32(((1 << reduce_bits_vert) >> 1));
  const __m128i res_add_const = _mm_set1_epi32(1 << offset_bits_vert);
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  assert(IMPLIES(conv_params->do_average, conv_params->is_compound));

  /* Note: For this code to work, the left/right frame borders need to be
  extended by at least 13 pixels each. By the time we get here, other
  code will have set up this border, but we allow an explicit check
  for debugging purposes.
  */
  /*for (i = 0; i < height; ++i) {
  for (j = 0; j < 13; ++j) {
  assert(ref[i * stride - 13 + j] == ref[i * stride]);
  assert(ref[i * stride + width + j] == ref[i * stride + (width - 1)]);
  }
  }*/
  __m128i res_add_const_1;
  if (conv_params->is_compound == 1) {
    res_add_const_1 = _mm_add_epi32(reduce_bits_vert_const, res_add_const);
  } else {
    res_add_const_1 = _mm_set1_epi32(-(1 << (bd + reduce_bits_vert - 1)) +
                                     ((1 << reduce_bits_vert) >> 1));
  }

  for (i = 0; i < p_height; i += 8) {
    for (j = 0; j < p_width; j += 8) {
      const int32_t src_x = (p_col + j + 4) << subsampling_x;
      const int32_t src_y = (p_row + i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      int32_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      int32_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      // Add in all the constant terms, including rounding and offset
      sx4 += alpha * (-4) + beta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);
      sy4 += gamma * (-4) + delta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);

      sx4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);
      sy4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);

      // Horizontal filter
      // If the block is aligned such that, after clamping, every sample
      // would be taken from the leftmost/rightmost column, then we can
      // skip the expensive horizontal filter.
      if (ix4 <= -7) {
        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] = _mm_set1_epi16(
              (1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
              ref[iy * stride] * (1 << (FILTER_BITS - reduce_bits_horiz)));
        }
      } else if (ix4 >= width + 6) {
        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] =
              _mm_set1_epi16((1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
                             ref[iy * stride + (width - 1)] *
                                 (1 << (FILTER_BITS - reduce_bits_horiz)));
        }
      } else if (((ix4 - 7) < 0) || ((ix4 + 9) > width)) {
        const int out_of_boundary_left = -(ix4 - 6);
        const int out_of_boundary_right = (ix4 + 8) - width;
        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          int sx = sx4 + beta * (k + 4);

          // Load source pixels
          __m128i src =
              _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
          if (out_of_boundary_left >= 0) {
            const __m128i shuffle_reg_left =
                _mm_loadu_si128((__m128i *)warp_pad_left[out_of_boundary_left]);
            src = _mm_shuffle_epi8(src, shuffle_reg_left);
          }
          if (out_of_boundary_right >= 0) {
            const __m128i shuffle_reg_right = _mm_loadu_si128(
                (__m128i *)warp_pad_right[out_of_boundary_right]);
            src = _mm_shuffle_epi8(src, shuffle_reg_right);
          }
          horizontal_filter(src, tmp, sx, alpha, k, offset_bits_horiz,
                            reduce_bits_horiz);
        }
      } else {
        prepare_warp_horizontal_filter(ref, tmp, stride, ix4, iy4, sx4, alpha,
                                       beta, p_height, height, i,
                                       offset_bits_horiz, reduce_bits_horiz);
      }

      // Vertical filter
      prepare_warp_vertical_filter(
          pred, tmp, conv_params, gamma, delta, p_height, p_stride, p_width, i,
          j, sy4, reduce_bits_vert, &res_add_const_1, round_bits, offset_bits);
    }
  }
}